

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.cc
# Opt level: O3

size_t __thiscall
google::protobuf::RepeatedField<absl::lts_20240722::Cord>::SpaceUsedExcludingSelfLong
          (RepeatedField<absl::lts_20240722::Cord> *this)

{
  int iVar1;
  int iVar2;
  const_reference pCVar3;
  ulong uVar4;
  size_t sVar5;
  size_t sVar6;
  
  iVar1 = internal::SooRep::size
                    (&this->soo_rep_,
                     (undefined1  [16])
                     ((undefined1  [16])(this->soo_rep_).field_0 & (undefined1  [16])0x4) ==
                     (undefined1  [16])0x0);
  sVar6 = (long)iVar1 << 4;
  iVar1 = internal::SooRep::size
                    (&this->soo_rep_,
                     (undefined1  [16])
                     ((undefined1  [16])(this->soo_rep_).field_0 & (undefined1  [16])0x4) ==
                     (undefined1  [16])0x0);
  if (0 < iVar1) {
    iVar1 = 0;
    do {
      pCVar3 = Get(this,iVar1);
      uVar4 = (ulong)(pCVar3->contents_).data_.rep_.field_0.data[0];
      if ((uVar4 & 1) == 0) {
        sVar5 = uVar4 >> 1;
      }
      else {
        sVar5 = ((pCVar3->contents_).data_.rep_.field_0.as_tree.rep)->length;
      }
      sVar6 = sVar6 + sVar5;
      iVar1 = iVar1 + 1;
      iVar2 = internal::SooRep::size
                        (&this->soo_rep_,
                         (undefined1  [16])
                         ((undefined1  [16])(this->soo_rep_).field_0 & (undefined1  [16])0x4) ==
                         (undefined1  [16])0x0);
    } while (iVar1 < iVar2);
  }
  return sVar6;
}

Assistant:

PROTOBUF_EXPORT_TEMPLATE_DEFINE size_t
RepeatedField<absl::Cord>::SpaceUsedExcludingSelfLong() const {
  size_t result = size() * sizeof(absl::Cord);
  for (int i = 0; i < size(); i++) {
    // Estimate only.
    result += Get(i).size();
  }
  return result;
}